

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

int32_t __thiscall
fasttext::Dictionary::getStringNoNewline
          (Dictionary *this,string_view in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  char *__s1;
  char cVar1;
  pointer piVar2;
  element_type *peVar3;
  iterator __position;
  string_view token;
  bool bVar4;
  entry_type eVar5;
  int32_t iVar6;
  void *pvVar7;
  char *pcVar8;
  ulong uVar9;
  size_type sVar10;
  int iVar11;
  char *pcVar12;
  ulong uVar13;
  ulong __n;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint32_t h;
  ulong uVar17;
  string_view w;
  vector<int,_std::allocator<int>_> word_hashes;
  vector<int,_std::allocator<int>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  ulong local_40;
  ulong local_38;
  
  pcVar8 = in._M_str;
  uVar14 = in._M_len;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  piVar2 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar2;
  }
  piVar2 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_50 = words;
  if (uVar14 == 0) {
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    local_48 = labels;
    while( true ) {
      lVar16 = 0;
      uVar17 = 0;
      pcVar12 = pcVar8;
      uVar13 = uVar14;
      while (pvVar7 = memchr(" \n\r\t\v\f",(int)pcVar8[uVar17],6), pvVar7 != (void *)0x0) {
        uVar17 = uVar17 + 1;
        uVar13 = uVar13 - 1;
        lVar16 = lVar16 + -1;
        pcVar12 = pcVar12 + 1;
        if (uVar14 == uVar17) goto LAB_00127834;
      }
      if (uVar17 == 0xffffffffffffffff) break;
      __s1 = pcVar8 + uVar17;
      __n = uVar14 - uVar17;
      local_40 = uVar15;
      if (__n == 0) {
        pcVar8 = pcVar8 + uVar14;
        h = 0x811c9dc5;
        __n = 0;
        uVar14 = 0;
        bVar4 = true;
      }
      else {
        local_38 = uVar13 + (uVar13 == 0);
        uVar15 = 0;
        do {
          pvVar7 = memchr(" \n\r\t\v\f",(int)__s1[uVar15],6);
          if (pvVar7 != (void *)0x0) goto LAB_0012768b;
          uVar15 = uVar15 + 1;
        } while (local_38 != uVar15);
        uVar15 = 0xffffffffffffffff;
LAB_0012768b:
        if (uVar15 <= __n) {
          __n = uVar15;
        }
        uVar9 = uVar13;
        if (uVar15 < uVar13) {
          uVar9 = uVar15;
        }
        pcVar8 = pcVar8 + (uVar9 - lVar16);
        uVar14 = (uVar14 - uVar9) - uVar17;
        if (__n == 0) {
          h = 0x811c9dc5;
          __n = 0;
          bVar4 = true;
        }
        else {
          h = 0x811c9dc5;
          if (uVar15 < uVar13) {
            uVar13 = uVar15;
          }
          do {
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
            h = ((int)cVar1 ^ h) * 0x1000193;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
          bVar4 = false;
        }
      }
      w._M_str = __s1;
      w._M_len = __n;
      iVar6 = find(this,w,h);
      iVar6 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar6];
      if (iVar6 < 0) {
        peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_60._M_len = __n;
        local_60._M_str = __s1;
        sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::find
                           (&local_60,(peVar3->label)._M_dataplus._M_p,0,
                            (peVar3->label)._M_string_length);
        eVar5 = sVar10 == 0;
      }
      else {
        eVar5 = getType(this,iVar6);
      }
      uVar15 = local_40;
      if (eVar5 == word) {
        token._M_str = __s1;
        token._M_len = __n;
        addSubwords(this,local_50,token,iVar6);
        local_60._M_len = CONCAT44(local_60._M_len._4_4_,h);
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_78,
                     (iterator)
                     local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_60);
        }
        else {
          *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = h;
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      else if ((-1 < iVar6) && (eVar5 == label)) {
        iVar11 = iVar6 - this->nwords_;
        local_60._M_len = CONCAT44(local_60._M_len._4_4_,iVar11);
        __position._M_current =
             (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_48,__position,(int *)&local_60);
        }
        else {
          *__position._M_current = iVar11;
          (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      if (((__n == DAT_0014c470) &&
          ((bVar4 || (iVar11 = bcmp(__s1,EOS_abi_cxx11_,__n), iVar11 == 0)))) || (uVar14 == 0))
      break;
    }
  }
LAB_00127834:
  addWordNgrams(this,local_50,&local_78,
                ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->wordNgrams);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (int32_t)uVar15;
}

Assistant:

int32_t Dictionary::getStringNoNewline(
    std::string_view in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string_view token;
  int32_t ntokens = 0;

  words.clear();
  labels.clear();
  while (readWordNoNewline(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}